

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

void __thiscall winmd::reader::TypeSig::TypeSig(TypeSig *this,table_base *table,byte_view *data)

{
  bool bVar1;
  ElementType EVar2;
  int iVar3;
  tuple<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>&> local_60 [16];
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_50;
  byte_view *local_20;
  byte_view *data_local;
  table_base *table_local;
  TypeSig *this_local;
  
  local_20 = data;
  data_local = (byte_view *)table;
  table_local = (table_base *)this;
  bVar1 = parse_szarray(table,data);
  this->m_is_szarray = bVar1;
  bVar1 = parse_array((table_base *)data_local,local_20);
  this->m_is_array = bVar1;
  iVar3 = parse_ptr((table_base *)data_local,local_20);
  this->m_ptr_count = iVar3;
  parse_cmods(&this->m_cmod,(table_base *)data_local,local_20);
  EVar2 = parse_element_type(local_20);
  this->m_element_type = EVar2;
  ParseType(&this->m_type,(table_base *)data_local,local_20);
  this->m_array_rank = 0;
  cppwinrt::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_array_sizes);
  if ((this->m_is_array & 1U) != 0) {
    parse_array_sizes(&local_50,(table_base *)data_local,local_20);
    std::tie<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((uint *)local_60,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this->m_array_rank);
    std::tuple<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>&>::operator=
              (local_60,&local_50);
    cppwinrt::std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    ~pair(&local_50);
  }
  return;
}

Assistant:

TypeSig(table_base const* table, byte_view& data)
            : m_is_szarray(parse_szarray(table, data))
            , m_is_array(parse_array(table, data))
            , m_ptr_count(parse_ptr(table, data))
            , m_cmod(parse_cmods(table, data))
            , m_element_type(parse_element_type(data))
            , m_type(ParseType(table, data))
        {
            if (m_is_array)
            {
                std::tie(m_array_rank, m_array_sizes) = parse_array_sizes(table, data);
            }
        }